

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

bool __thiscall
crnlib::qdxt5::pack(qdxt5 *this,dxt5_block *pDst_elements,uint elements_per_block,
                   qdxt5_params *params)

{
  vector<crnlib::vector<unsigned_int>_> *pvVar1;
  elemental_vector *this_00;
  int iVar2;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  crn_thread_id_t cVar6;
  vector<unsigned_int> *pvVar7;
  executable_task *peVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint64 data;
  uint uVar13;
  long lVar14;
  task_pool *ptVar15;
  float __x;
  float fVar16;
  float fVar17;
  optimize_selectors_params optimize_selectors_task_params;
  vector<crnlib::vector<unsigned_int>_> *local_38;
  
  cVar6 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar6;
  this->m_canceled = false;
  this->m_pDst_elements = pDst_elements;
  this->m_elements_per_block = elements_per_block;
  memcpy(&this->m_params,params,0x62d);
  this->m_prev_percentage_complete = -1;
  __x = (float)(this->m_params).m_quality_level / 255.0;
  fVar16 = powf(__x,2.1);
  fVar17 = powf(__x,1.65);
  uVar11 = this->m_max_selector_clusters;
  uVar9 = (uint)(long)((float)uVar11 * fVar17);
  if (uVar9 < uVar11) {
    uVar11 = uVar9;
  }
  uVar5 = 0x20;
  if (0x1f < uVar9) {
    uVar5 = uVar11;
  }
  if (__x < 1.0) {
    uVar11 = (this->m_endpoint_clusterizer).m_codebook.m_size;
    uVar9 = (uint)(long)(fVar16 * (float)uVar11);
    if (uVar9 < uVar11) {
      uVar11 = uVar9;
    }
    uVar10 = 0x10;
    if (0xf < uVar9) {
      uVar10 = uVar11;
    }
    clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
              (&this->m_endpoint_clusterizer,uVar10,&this->m_endpoint_cluster_indices);
  }
  else {
    pvVar1 = &this->m_endpoint_cluster_indices;
    uVar11 = this->m_num_blocks;
    uVar9 = (this->m_endpoint_cluster_indices).m_size;
    uVar13 = uVar9 - uVar11;
    if (uVar13 != 0) {
      if (uVar9 < uVar11 || uVar13 == 0) {
        if ((this->m_endpoint_cluster_indices).m_capacity < uVar11) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar1,uVar11,uVar9 + 1 == uVar11,0x10,(object_mover)0x0,
                     false);
          uVar9 = (this->m_endpoint_cluster_indices).m_size;
        }
        if (uVar11 - uVar9 != 0) {
          memset(pvVar1->m_p + uVar9,0,(ulong)(uVar11 - uVar9) << 4);
        }
      }
      else {
        pvVar7 = pvVar1->m_p;
        lVar14 = 0;
        do {
          pvVar3 = *(void **)((long)&pvVar7[uVar11].m_p + lVar14);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar13 << 4 != lVar14);
      }
      (this->m_endpoint_cluster_indices).m_size = uVar11;
      uVar11 = this->m_num_blocks;
    }
    if (uVar11 != 0) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        pvVar7 = pvVar1->m_p;
        iVar2 = *(int *)((long)&pvVar7->m_size + lVar14);
        if (iVar2 != 1) {
          this_00 = (elemental_vector *)((long)&pvVar7->m_p + lVar14);
          if (iVar2 == 0) {
            uVar10 = 0;
            if (*(int *)((long)&pvVar7->m_capacity + lVar14) == 0) {
              elemental_vector::increase_capacity(this_00,1,true,4,(object_mover)0x0,false);
              uVar10 = this_00->m_size;
            }
            memset((void *)((ulong)uVar10 * 4 + (long)this_00->m_p),0,(ulong)(1 - uVar10) << 2);
          }
          this_00->m_size = 1;
          pvVar7 = pvVar1->m_p;
        }
        **(undefined4 **)((long)&pvVar7->m_p + lVar14) = (int)uVar12;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar12 < this->m_num_blocks);
    }
  }
  pvVar1 = this->m_cached_selector_cluster_indices + params->m_quality_level;
  this->m_progress_start = 0;
  if (__x < 1.0) {
    if (pvVar1->m_size == 0) {
      uVar10 = 0x21;
    }
    else {
      uVar10 = 0x32;
    }
    if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
      uVar10 = 10;
    }
    this->m_progress_range = uVar10;
  }
  else {
    this->m_progress_range = 100;
  }
  ptVar15 = this->m_pTask_pool;
  data = 0;
  do {
    peVar8 = (executable_task *)crnlib_malloc(0x28);
    peVar8->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db670;
    peVar8[1]._vptr_executable_task = (_func_int **)this;
    peVar8[2]._vptr_executable_task = (_func_int **)pack_endpoints_task;
    peVar8[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&peVar8[4]._vptr_executable_task = 1;
    task_pool::queue_task(ptVar15,peVar8,data,(void *)0x0);
    uVar11 = (int)data + 1;
    data = (uint64)uVar11;
    ptVar15 = this->m_pTask_pool;
  } while (uVar11 <= ptVar15->m_num_threads);
  task_pool::join(ptVar15);
  bVar4 = this->m_canceled;
  if (__x < 1.0 && (bool)bVar4 == false) {
    if ((pvVar1->m_size == 0) &&
       (create_selector_clusters(this,uVar5,pvVar1), this->m_canceled == true)) {
      pvVar7 = pvVar1->m_p;
      if (pvVar7 != (vector<unsigned_int> *)0x0) {
        uVar11 = pvVar1->m_size;
        if ((ulong)uVar11 != 0) {
          lVar14 = 0;
          do {
            pvVar3 = *(void **)((long)&pvVar7->m_p + lVar14);
            if (pvVar3 != (void *)0x0) {
              crnlib_free(pvVar3);
            }
            lVar14 = lVar14 + 0x10;
          } while ((ulong)uVar11 << 4 != lVar14);
          pvVar7 = pvVar1->m_p;
        }
        crnlib_free(pvVar7);
        pvVar1->m_p = (vector<unsigned_int> *)0x0;
        pvVar1->m_size = 0;
        pvVar1->m_capacity = 0;
      }
      return false;
    }
    uVar5 = this->m_progress_start + this->m_progress_range;
    this->m_progress_start = uVar5;
    this->m_progress_range = 100 - uVar5;
    ptVar15 = this->m_pTask_pool;
    uVar11 = 0;
    local_38 = pvVar1;
    do {
      peVar8 = (executable_task *)crnlib_malloc(0x28);
      peVar8->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db670;
      peVar8[1]._vptr_executable_task = (_func_int **)this;
      peVar8[2]._vptr_executable_task = (_func_int **)optimize_selectors_task;
      peVar8[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar8[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar15,peVar8,(ulong)uVar11,&local_38);
      uVar11 = uVar11 + 1;
      ptVar15 = this->m_pTask_pool;
    } while (uVar11 <= ptVar15->m_num_threads);
    task_pool::join(ptVar15);
    bVar4 = this->m_canceled;
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool qdxt5::pack(dxt5_block* pDst_elements, uint elements_per_block, const qdxt5_params& params) {
  CRNLIB_ASSERT(m_num_blocks);

  m_main_thread_id = crn_get_current_thread_id();
  m_canceled = false;

  m_pDst_elements = pDst_elements;
  m_elements_per_block = elements_per_block;
  m_params = params;

  m_prev_percentage_complete = -1;

  CRNLIB_ASSERT(m_params.m_quality_level <= qdxt5_params::cMaxQuality);
  const float quality = m_params.m_quality_level / (float)qdxt5_params::cMaxQuality;
  const float endpoint_quality = powf(quality, 2.1f);
  const float selector_quality = powf(quality, 1.65f);

  const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 16U, m_endpoint_clusterizer.get_codebook_size());
  const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 32U, m_max_selector_clusters);

#if QDXT5_DEBUGGING
  trace("max endpoint clusters: %u\n", max_endpoint_clusters);
  trace("max selector clusters: %u\n", max_selector_clusters);
#endif

  if (quality >= 1.0f) {
    m_endpoint_cluster_indices.resize(m_num_blocks);
    for (uint i = 0; i < m_num_blocks; i++) {
      m_endpoint_cluster_indices[i].resize(1);
      m_endpoint_cluster_indices[i][0] = i;
    }
  } else
    m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);

  uint max_blocks = 0;
  for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++) {
    uint num = m_endpoint_cluster_indices[i].size();
    max_blocks = math::maximum(max_blocks, num);
  }

  crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

  m_progress_start = 0;
  if (quality >= 1.0f)
    m_progress_range = 100;
  else if (selector_cluster_indices.empty())
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
  else
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::pack_endpoints_task, i);
  m_pTask_pool->join();

  if (m_canceled)
    return false;

  if (quality >= 1.0f)
    return true;

  if (selector_cluster_indices.empty()) {
    create_selector_clusters(max_selector_clusters, selector_cluster_indices);

    if (m_canceled) {
      selector_cluster_indices.clear();

      return false;
    }
  }

  m_progress_start += m_progress_range;
  m_progress_range = 100 - m_progress_start;

  optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::optimize_selectors_task, i, &optimize_selectors_task_params);

  m_pTask_pool->join();

  return !m_canceled;
}